

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderMaxAtomicCountersTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMaxAtomicCountersTest *this)

{
  ostream *poVar1;
  char *local_1d8;
  char *gs_code_raw;
  string gs_code;
  stringstream local_1a0 [8];
  stringstream code_sstream;
  ostream local_190;
  GeometryShaderMaxAtomicCountersTest *local_18;
  GeometryShaderMaxAtomicCountersTest *this_local;
  string *gs_code_specialized;
  
  local_18 = this;
  this_local = (GeometryShaderMaxAtomicCountersTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nuniform int n_loop_iterations;\nflat in int vertex_id[];\n\n"
                 );
  poVar1 = std::operator<<(&local_190,"layout(binding = 0) uniform atomic_uint acs[");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,this->m_gl_max_geometry_atomic_counters_ext_value);
  poVar1 = std::operator<<(poVar1,"];\n");
  std::operator<<(poVar1,
                  "\nvoid main()\n{\n    for (int counter_id = 1;\n             counter_id <= n_loop_iterations;\n           ++counter_id)\n    {\n        if ((vertex_id[0] % counter_id) == 0)\n        {\n            atomicCounterIncrement(acs[counter_id - 1]);\n        }\n    }\n\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringstream::str();
  local_1d8 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_1d8);
  std::__cxx11::string::~string((string *)&gs_code_raw);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMaxAtomicCountersTest::getGSCode()
{
	std::stringstream code_sstream;

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"uniform int n_loop_iterations;\n"
					"flat in int vertex_id[];\n"
					"\n";

	code_sstream << "layout(binding = 0) uniform atomic_uint acs[" << m_gl_max_geometry_atomic_counters_ext_value
				 << "];\n"
				 << "\n"
					"void main()\n"
					"{\n"
					"    for (int counter_id = 1;\n"
					"             counter_id <= n_loop_iterations;\n"
					"           ++counter_id)\n"
					"    {\n"
					"        if ((vertex_id[0] % counter_id) == 0)\n"
					"        {\n"
					"            atomicCounterIncrement(acs[counter_id - 1]);\n"
					"        }\n"
					"    }\n"
					"\n"
					"    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1, /* parts */ &gs_code_raw);

	return gs_code_specialized;
}